

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

target_ulong_conflict
helper_lscbx_ppc(CPUPPCState_conflict *env,target_ulong_conflict addr,uint32_t reg,uint32_t ra,
                uint32_t rb)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uintptr_t unaff_retaddr;
  
  uVar2 = env->xer;
  iVar3 = 0x18;
  uVar4 = 0;
  while( true ) {
    if ((uVar2 & 0x7f) <= uVar4) {
      return uVar4;
    }
    uVar1 = cpu_ldub_data_ra_ppc(env,addr + uVar4,unaff_retaddr);
    if ((reg != rb) && (ra == 0 || reg != ra)) {
      env->gpr[reg] =
           uVar1 << ((byte)iVar3 & 0x1f) | ~(0xff << ((byte)iVar3 & 0x1f)) & env->gpr[reg];
    }
    uVar2 = env->xer;
    if (uVar1 == (uVar2 >> 8 & 0xff)) break;
    if (iVar3 == 0) {
      reg = reg + 1 & 0x1f;
      iVar3 = 0x18;
    }
    else {
      iVar3 = iVar3 + -8;
    }
    uVar4 = uVar4 + 1;
  }
  return uVar4;
}

Assistant:

target_ulong helper_lscbx(CPUPPCState *env, target_ulong addr, uint32_t reg,
                          uint32_t ra, uint32_t rb)
{
    int i, c, d;

    d = 24;
    for (i = 0; i < xer_bc; i++) {
        c = cpu_ldub_data_ra(env, addr, GETPC());
        addr = addr_add(env, addr, 1);
        /* ra (if not 0) and rb are never modified */
        if (likely(reg != rb && (ra == 0 || reg != ra))) {
            env->gpr[reg] = (env->gpr[reg] & ~(0xFF << d)) | (c << d);
        }
        if (unlikely(c == xer_cmp)) {
            break;
        }
        if (likely(d != 0)) {
            d -= 8;
        } else {
            d = 24;
            reg++;
            reg = reg & 0x1F;
        }
    }
    return i;
}